

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<int,google::protobuf::internal::ExtensionSet::Extension>::
     transfer<std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
               (allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  TrivialAtomicInt TVar4;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> *ppVar5;
  undefined1 local_21;
  slot_type *psStack_20;
  type is_relocatable;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> *alloc_local
  ;
  
  psStack_20 = old_slot;
  memset(&local_21,0,1);
  map_slot_policy<int,_google::protobuf::internal::ExtensionSet::Extension>::emplace(new_slot);
  ppVar5 = std::launder<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                     (&new_slot->value);
  *(undefined8 *)ppVar5 = *(undefined8 *)psStack_20;
  (ppVar5->second).field_0 = (psStack_20->value).second.field_0;
  bVar1 = ((Extension *)((long)psStack_20 + 8))->is_repeated;
  uVar2 = ((Extension *)((long)psStack_20 + 8))->field_0xa;
  bVar3 = ((Extension *)((long)psStack_20 + 8))->is_packed;
  TVar4.int_ = (((Extension *)((long)psStack_20 + 8))->cached_size).int_[0];
  (ppVar5->second).type = ((Extension *)((long)psStack_20 + 8))->type;
  (ppVar5->second).is_repeated = bVar1;
  (ppVar5->second).field_0xa = uVar2;
  (ppVar5->second).is_packed = bVar3;
  (ppVar5->second).cached_size = (TrivialAtomicInt)TVar4.int_;
  (ppVar5->second).descriptor = (psStack_20->value).second.descriptor;
  return;
}

Assistant:

static auto transfer(Allocator* alloc, slot_type* new_slot,
                       slot_type* old_slot) {
    auto is_relocatable =
        typename absl::is_trivially_relocatable<value_type>::type();

    emplace(new_slot);
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606
    if (is_relocatable) {
      // TODO(b/247130232,b/251814870): remove casts after fixing warnings.
      std::memcpy(static_cast<void*>(std::launder(&new_slot->value)),
                  static_cast<const void*>(&old_slot->value),
                  sizeof(value_type));
      return is_relocatable;
    }
#endif

    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(
          *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                   std::move(old_slot->value));
    }
    destroy(alloc, old_slot);
    return is_relocatable;
  }